

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_constructors_initialiser_lists_Test::TestBody
          (test_matrix_sparse_constructors_initialiser_lists_Test *this)

{
  pointer *ppdVar1;
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  initializer_list<double> value_02;
  initializer_list<double> value_03;
  initializer_list<double> value_04;
  initializer_list<double> value_05;
  DeathTest *pDVar2;
  DeathTest *pDVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Scalar *pSVar7;
  char *pcVar8;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> non_zero_02;
  initializer_list<unsigned_long> non_zero_03;
  initializer_list<unsigned_long> non_zero_04;
  initializer_list<unsigned_long> non_zero_05;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> index_02;
  initializer_list<unsigned_long> index_03;
  initializer_list<unsigned_long> index_04;
  initializer_list<unsigned_long> index_05;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Matrix_Sparse matrix;
  DeathTest *local_410;
  undefined1 local_408 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_400;
  undefined1 *local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  Matrix_Sparse local_3c8;
  undefined1 *local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  pointer *local_360;
  undefined8 uStack_358;
  pointer *local_350;
  undefined8 uStack_348;
  pointer *local_340;
  undefined8 uStack_338;
  pointer *local_330;
  undefined8 uStack_328;
  PolymorphicMatcher *local_320;
  undefined8 uStack_318;
  Matrix_Sparse *local_310;
  undefined8 uStack_308;
  Matrix_Sparse *local_300;
  undefined8 uStack_2f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_290;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_278;
  Matrix_Sparse local_260;
  Matrix_Sparse local_210;
  Matrix_Sparse local_1c0;
  Matrix_Sparse local_170;
  Matrix_Sparse local_120;
  Matrix_Sparse local_d0;
  Matrix_Sparse local_80;
  
  local_378 = (undefined1 *)0x5;
  uStack_370 = 5;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.column_size = 2;
  local_368 = 7;
  local_3e8 = 3;
  uStack_3e0 = 4;
  local_3f8 = (undefined1 *)0x2;
  uStack_3f0 = 0;
  local_408 = (undefined1  [8])0x1;
  _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_3d8 = 3;
  local_300 = &local_3c8;
  local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4014000000000000;
  local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4018000000000000;
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_4008000000000000;
  local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x401c000000000000;
  uStack_2f8 = 7;
  value._M_len = 7;
  value._M_array = (iterator)local_300;
  non_zero._M_len = 5;
  non_zero._M_array =
       (iterator)
       &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  index._M_len = 7;
  index._M_array = (iterator)local_408;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_260,non_zero,index,value,5);
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_260.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_260.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)(((long)local_260.row_non_zero.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_260.row_non_zero.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_408,"matrix.size_row()","4",(unsigned_long *)&local_3c8,
             (int *)&local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x29,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_260.column_size;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_408,"matrix.size_column()","5",(unsigned_long *)&local_3c8,
             (int *)&local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2a,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)local_260.column_index.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_260.column_index.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,7);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_408,"matrix.size_non_zero()","7",(unsigned_long *)&local_3c8,
             (int *)&local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)0x1;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[0][1]","1.0",*pSVar7,1.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)0x3;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[0][3]","2.0",*pSVar7,2.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2d,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)0x0;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[1][0]","4.0",*pSVar7,4.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2e,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)0x2;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[1][2]","3.0",*pSVar7,3.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2f,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)0x3;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[1][3]","5.0",*pSVar7,5.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x30,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)0x3;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[3][3]","7.0",*pSVar7,7.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x31,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  ppdVar1 = &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (DeathTest *)&DAT_00000004;
  pSVar7 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[3][4]","6.0",*pSVar7,6.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x32,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x169309;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_278,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 0, 1}, {1.0, 2.0, 3.0, 4.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_278,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x36,&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_278);
    pDVar2 = local_410;
    bVar4 = true;
    if (bVar5) {
      if (local_410 != (DeathTest *)0x0) {
        iVar6 = (*local_410->_vptr_DeathTest[2])(local_410);
        pDVar3 = local_410;
        if (iVar6 == 0) {
          iVar6 = (*local_410->_vptr_DeathTest[3])(local_410);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_0010f8d4;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_3c8.column_size = 2;
              local_378 = (undefined1 *)0x3;
              local_3f8 = (undefined1 *)0x0;
              uStack_3f0 = 1;
              local_408 = (undefined1  [8])0x1;
              _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_4008000000000000;
              local_3c8.column_index.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
              uStack_308 = 4;
              value_00._M_len = 4;
              value_00._M_array = (iterator)&local_3c8;
              non_zero_00._M_len = 3;
              non_zero_00._M_array =
                   (iterator)
                   &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
              index_00._M_len = 4;
              index_00._M_array = (iterator)local_408;
              local_310 = &local_3c8;
              Disa::Matrix_Sparse::Matrix_Sparse(&local_80,non_zero_00,index_00,value_00,2);
              Disa::Matrix_Sparse::~Matrix_Sparse(&local_80);
            }
            (*local_410->_vptr_DeathTest[5])(local_410,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_0010f8d4:
          bVar4 = false;
          bVar5 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar5) goto LAB_0010f8eb;
      }
      bVar4 = false;
    }
LAB_0010f8eb:
    if (bVar4) goto LAB_0010f8f0;
  }
  else {
LAB_0010f8f0:
    testing::Message::Message((Message *)local_408);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x36,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_408 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x169309;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_290,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0, 4.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_290,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x37,&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_290);
    pDVar2 = local_410;
    bVar4 = true;
    if (bVar5) {
      if (local_410 != (DeathTest *)0x0) {
        iVar6 = (*local_410->_vptr_DeathTest[2])(local_410);
        pDVar3 = local_410;
        if (iVar6 == 0) {
          iVar6 = (*local_410->_vptr_DeathTest[3])(local_410);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_0010fae7;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x2;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
              local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
              local_3c8.column_size = 0;
              local_378 = (undefined1 *)0x0;
              local_3f8 = &DAT_4008000000000000;
              uStack_3f0 = 0x4010000000000000;
              local_408 = (undefined1  [8])0x3ff0000000000000;
              _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
              uStack_318 = 4;
              value_01._M_len = 4;
              value_01._M_array = (iterator)local_408;
              non_zero_01._M_len = 3;
              non_zero_01._M_array = (iterator)&local_3c8;
              index_01._M_len = 3;
              index_01._M_array =
                   (iterator)
                   &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_320 = (PolymorphicMatcher *)local_408;
              Disa::Matrix_Sparse::Matrix_Sparse(&local_d0,non_zero_01,index_01,value_01,2);
              Disa::Matrix_Sparse::~Matrix_Sparse(&local_d0);
            }
            (*local_410->_vptr_DeathTest[5])(local_410,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_0010fae7:
          bVar4 = false;
          bVar5 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar5) goto LAB_0010fafe;
      }
      bVar4 = false;
    }
LAB_0010fafe:
    if (bVar4) goto LAB_0010fb03;
  }
  else {
LAB_0010fb03:
    testing::Message::Message((Message *)local_408);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x37,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_408 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_408 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x169309;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2a8,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({1, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x38,&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2a8);
    pDVar2 = local_410;
    iVar6 = 6;
    if (bVar4) {
      if (local_410 != (DeathTest *)0x0) {
        iVar6 = (*local_410->_vptr_DeathTest[2])(local_410);
        pDVar3 = local_410;
        if (iVar6 == 0) {
          iVar6 = (*local_410->_vptr_DeathTest[3])(local_410);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_0010fcfa;
          iVar6 = 6;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_408 = (undefined1  [8])0x1;
              _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
              local_3f8 = (undefined1 *)0x3;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x1;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
              local_3c8.column_size = 0x4000000000000000;
              local_378 = &DAT_4008000000000000;
              uStack_328 = 3;
              value_02._M_len = 3;
              value_02._M_array = (iterator)ppdVar1;
              non_zero_02._M_len = 3;
              non_zero_02._M_array = (iterator)local_408;
              index_02._M_len = 3;
              index_02._M_array = (iterator)&local_3c8;
              local_330 = ppdVar1;
              Disa::Matrix_Sparse::Matrix_Sparse(&local_120,non_zero_02,index_02,value_02,2);
              Disa::Matrix_Sparse::~Matrix_Sparse(&local_120);
            }
            (*local_410->_vptr_DeathTest[5])(local_410,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_0010fcfa:
          iVar6 = 0;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_0010fd11;
      }
      iVar6 = 0;
    }
LAB_0010fd11:
    if (iVar6 != 0) goto LAB_0010fd16;
  }
  else {
LAB_0010fd16:
    testing::Message::Message((Message *)local_408);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x38,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_408 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x169309;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2c0,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({2, 0, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x39,&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2c0);
    pDVar2 = local_410;
    bVar4 = true;
    if (bVar5) {
      if (local_410 != (DeathTest *)0x0) {
        iVar6 = (*local_410->_vptr_DeathTest[2])(local_410);
        pDVar3 = local_410;
        if (iVar6 == 0) {
          iVar6 = (*local_410->_vptr_DeathTest[3])(local_410);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_0010ff0d;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_408 = (undefined1  [8])0x2;
              _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_3f8 = (undefined1 *)0x3;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x1;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
              local_3c8.column_size = 0x4000000000000000;
              local_378 = &DAT_4008000000000000;
              uStack_338 = 3;
              value_03._M_len = 3;
              value_03._M_array = (iterator)ppdVar1;
              non_zero_03._M_len = 3;
              non_zero_03._M_array = (iterator)local_408;
              index_03._M_len = 3;
              index_03._M_array = (iterator)&local_3c8;
              local_340 = ppdVar1;
              Disa::Matrix_Sparse::Matrix_Sparse(&local_170,non_zero_03,index_03,value_03,2);
              Disa::Matrix_Sparse::~Matrix_Sparse(&local_170);
            }
            (*local_410->_vptr_DeathTest[5])(local_410,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_0010ff0d:
          bVar4 = false;
          bVar5 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar5) goto LAB_0010ff24;
      }
      bVar4 = false;
    }
LAB_0010ff24:
    if (bVar4) goto LAB_0010ff29;
  }
  else {
LAB_0010ff29:
    testing::Message::Message((Message *)local_408);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x39,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_408 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x169309;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2d8,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 2}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x3a,&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2d8);
    pDVar2 = local_410;
    iVar6 = 10;
    if (bVar4) {
      if (local_410 != (DeathTest *)0x0) {
        iVar6 = (*local_410->_vptr_DeathTest[2])(local_410);
        pDVar3 = local_410;
        if (iVar6 == 0) {
          iVar6 = (*local_410->_vptr_DeathTest[3])(local_410);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_00110120;
          iVar6 = 10;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_408 = (undefined1  [8])0x0;
              _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
              local_3f8 = (undefined1 *)0x3;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x1;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
              local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
              local_3c8.column_size = 0x4000000000000000;
              local_378 = &DAT_4008000000000000;
              uStack_348 = 3;
              value_04._M_len = 3;
              value_04._M_array = (iterator)ppdVar1;
              non_zero_04._M_len = 3;
              non_zero_04._M_array = (iterator)local_408;
              index_04._M_len = 3;
              index_04._M_array = (iterator)&local_3c8;
              local_350 = ppdVar1;
              Disa::Matrix_Sparse::Matrix_Sparse(&local_1c0,non_zero_04,index_04,value_04,2);
              Disa::Matrix_Sparse::~Matrix_Sparse(&local_1c0);
            }
            (*local_410->_vptr_DeathTest[5])(local_410,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_00110120:
          iVar6 = 0;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_00110137;
      }
      iVar6 = 0;
    }
LAB_00110137:
    if (iVar6 != 0) goto LAB_0011013c;
  }
  else {
LAB_0011013c:
    testing::Message::Message((Message *)local_408);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x3a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_408 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x169309;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2f0,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 1, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x3b,&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2f0);
    pDVar2 = local_410;
    iVar6 = 0xc;
    if (bVar4) {
      if (local_410 != (DeathTest *)0x0) {
        iVar6 = (*local_410->_vptr_DeathTest[2])(local_410);
        pDVar3 = local_410;
        if (iVar6 == 0) {
          iVar6 = (*local_410->_vptr_DeathTest[3])(local_410);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
          iVar6 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar6 != '\0') goto LAB_00110333;
          iVar6 = 0xc;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_408 = (undefined1  [8])0x0;
              _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
              local_3f8 = (undefined1 *)0x3;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x1;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x1;
              local_3c8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
              local_3c8.column_size = 0x4000000000000000;
              local_378 = &DAT_4008000000000000;
              uStack_358 = 3;
              value_05._M_len = 3;
              value_05._M_array = (iterator)ppdVar1;
              non_zero_05._M_len = 3;
              non_zero_05._M_array = (iterator)local_408;
              index_05._M_len = 3;
              index_05._M_array = (iterator)&local_3c8;
              local_360 = ppdVar1;
              Disa::Matrix_Sparse::Matrix_Sparse(&local_210,non_zero_05,index_05,value_05,2);
              Disa::Matrix_Sparse::~Matrix_Sparse(&local_210);
            }
            (*local_410->_vptr_DeathTest[5])(local_410,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_00110333:
          iVar6 = 0;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_00110348;
      }
      iVar6 = 0;
    }
LAB_00110348:
    if (iVar6 == 0) goto LAB_001103a3;
  }
  testing::Message::Message((Message *)local_408);
  pcVar8 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x3b,pcVar8);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_408 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    (**(code **)(*(long *)local_408 + 8))();
  }
LAB_001103a3:
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_260);
  return;
}

Assistant:

TEST(test_matrix_sparse, constructors_initialiser_lists) {
  Matrix_Sparse matrix({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_EQ(matrix.size_row(), 4);
  EXPECT_EQ(matrix.size_column(), 5);
  EXPECT_EQ(matrix.size_non_zero(), 7);
  EXPECT_DOUBLE_EQ(matrix[0][1], 1.0);
  EXPECT_DOUBLE_EQ(matrix[0][3], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 4.0);
  EXPECT_DOUBLE_EQ(matrix[1][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][3], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][3], 7.0);
  EXPECT_DOUBLE_EQ(matrix[3][4], 6.0);

  // Valid construction 2x2: Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 0, 1}, {1.0, 2.0, 3.0, 4.0}, 2),
               ".*");  // more column indexes than non-zero.back().
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0, 4.0}, 2), ".*");  // mismatch column and entry size.
  EXPECT_DEATH(Matrix_Sparse({1, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // first non-zero value is not 0.
  EXPECT_DEATH(Matrix_Sparse({2, 0, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // un-ordered non-zeros
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 2}, {1.0, 2.0, 3.0}, 2), ".*");       // column index out of range
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 1, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // repeated column index
}